

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cyclichash.h
# Opt level: O2

unsigned_long_long __thiscall
CyclicHash<unsigned_long_long,unsigned_char>::
hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (CyclicHash<unsigned_long_long,unsigned_char> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  pointer puVar1;
  unsigned_long_long uVar2;
  uint uVar3;
  
  puVar1 = (c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = 0;
  for (uVar3 = 0;
      (ulong)uVar3 <
      (ulong)((long)(c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1); uVar3 = uVar3 + 1) {
    uVar2 = (uVar2 >> ((char)*(undefined4 *)(this + 0xc) - 1U & 0x3f) |
            (*(ulong *)(this + 0x810) & uVar2) * 2) ^
            *(ulong *)(this + (ulong)puVar1[uVar3] * 8 + 0x10);
  }
  return uVar2;
}

Assistant:

hashvaluetype hash(container &c) {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      fastleftshift1(answer);
      answer ^= hasher.hashvalues[static_cast<unsigned int>(c[k])];
    }
    return answer;
  }